

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadPackedFixed<double>
          (EpsCopyInputStream *this,char *ptr,int size,RepeatedField<double> *out)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *ptr_00;
  pair<const_char_*,_bool> pVar4;
  
  iVar1 = *(int *)&this->buffer_end_ - (int)ptr;
  do {
    uVar2 = iVar1 + 0x10;
    if (size <= (int)uVar2) {
      RepeatedField<double>::Reserve(out,out->current_size_ + (size >> 3));
      uVar2 = size & 0xfffffff8;
      iVar1 = out->current_size_;
      out->current_size_ = (size >> 3) + iVar1;
      memcpy((void *)((long)iVar1 * 8 + (long)out->arena_or_elements_),ptr,(long)(int)uVar2);
      if (size != uVar2) {
        return (char *)0x0;
      }
      return ptr + (int)uVar2;
    }
    RepeatedField<double>::Reserve(out,out->current_size_ + ((int)uVar2 >> 3));
    uVar3 = uVar2 & 0xfffffff8;
    iVar1 = out->current_size_;
    out->current_size_ = ((int)uVar2 >> 3) + iVar1;
    memcpy((void *)((long)iVar1 * 8 + (long)out->arena_or_elements_),ptr,(long)(int)uVar3);
    ptr_00 = ptr + (int)uVar3;
    if (ptr_00 < this->limit_end_) {
      pVar4._8_8_ = 0;
      pVar4.first = ptr_00;
    }
    else {
      pVar4._8_8_ = 1;
      pVar4.first = ptr_00;
      if ((long)ptr_00 - (long)this->buffer_end_ != (long)this->limit_) {
        pVar4 = DoneFallback(this,ptr_00,-1);
      }
    }
    ptr = pVar4.first;
    size = size - uVar3;
    iVar1 = *(int *)&this->buffer_end_ - (int)pVar4.first;
  } while (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedFixed(const char* ptr, int size,
                                                RepeatedField<T>* out) {
  int nbytes = buffer_end_ + kSlopBytes - ptr;
  while (size > nbytes) {
    int num = nbytes / sizeof(T);
    int old_entries = out->size();
    out->Reserve(old_entries + num);
    int block_size = num * sizeof(T);
    auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
    std::memcpy(dst, ptr, block_size);
#else
    for (int i = 0; i < num; i++)
      dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
    ptr += block_size;
    size -= block_size;
    if (DoneWithCheck(&ptr, -1)) return nullptr;
    nbytes = buffer_end_ + kSlopBytes - ptr;
  }
  int num = size / sizeof(T);
  int old_entries = out->size();
  out->Reserve(old_entries + num);
  int block_size = num * sizeof(T);
  auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
  std::memcpy(dst, ptr, block_size);
#else
  for (int i = 0; i < num; i++) dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
  ptr += block_size;
  if (size != block_size) return nullptr;
  return ptr;
}